

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.y
# Opt level: O2

void __thiscall DocumentStorage::~DocumentStorage(DocumentStorage *this)

{
  Element *this_00;
  int4 i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < (ulong)(*(long *)&this->field_0x8 - *(long *)this >> 3); uVar1 = uVar1 + 1
      ) {
    this_00 = *(Element **)(*(long *)this + uVar1 * 8);
    if (this_00 != (Element *)0x0) {
      Element::~Element(this_00);
      operator_delete(this_00);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Element_*>_>_>
               *)&this->tagmap);
  std::_Vector_base<Document_*,_std::allocator<Document_*>_>::~_Vector_base
            ((_Vector_base<Document_*,_std::allocator<Document_*>_> *)this);
  return;
}

Assistant:

DocumentStorage::~DocumentStorage(void)

{
  for(int4 i=0;i<doclist.size();++i) {
    if (doclist[i] != (Document *)0)
      delete doclist[i];
  }
}